

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O0

int WI_drawLF(void)

{
  FTexture *tex;
  int iVar1;
  int iVar2;
  char *levelname;
  int local_c;
  int y;
  
  iVar1 = CleanYfac << 1;
  tex = wbs->LName0;
  levelname = FString::operator_cast_to_char_(lnametexts);
  local_c = WI_DrawName(iVar1,tex,levelname);
  iVar1 = FFont::GetHeight(mapname.mFont);
  iVar2 = FFont::GetHeight(finished.mFont);
  local_c = local_c - ((iVar1 - iVar2) * CleanYfac) / 4;
  iVar1 = FFont::GetHeight(finished.mFont);
  if (local_c < (0x32 - (iVar1 * 3) / 4) * CleanYfac) {
    local_c = WI_DrawPatchText(local_c,&finished,"WI_FINISHED");
  }
  return local_c;
}

Assistant:

int WI_drawLF ()
{
	int y = WI_TITLEY * CleanYfac;

	y = WI_DrawName(y, wbs->LName0, lnametexts[0]);
	
	// Adjustment for different font sizes for map name and 'finished'.
	y -= ((mapname.mFont->GetHeight() - finished.mFont->GetHeight()) * CleanYfac) / 4;

	// draw "Finished!"
	if (y < (NG_STATSY - finished.mFont->GetHeight()*3/4) * CleanYfac)
	{
		// don't draw 'finished' if the level name is too tall
		y = WI_DrawPatchText(y, &finished, "WI_FINISHED");
	}
	return y;
}